

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content_stream.cpp
# Opt level: O0

char __thiscall dap::ContentReader::matchAny(ContentReader *this,char *chars)

{
  bool bVar1;
  byte *pbVar2;
  char *pcVar3;
  char *p;
  int c;
  char *chars_local;
  ContentReader *this_local;
  
  bVar1 = buffer(this,1);
  if (bVar1) {
    pbVar2 = std::deque<unsigned_char,_std::allocator<unsigned_char>_>::front(&this->buf);
    pcVar3 = strchr(chars,(uint)*pbVar2);
    if (pcVar3 == (char *)0x0) {
      this_local._7_1_ = '\0';
    }
    else {
      std::deque<unsigned_char,_std::allocator<unsigned_char>_>::pop_front(&this->buf);
      this_local._7_1_ = *pcVar3;
    }
  }
  else {
    this_local._7_1_ = '\0';
  }
  return this_local._7_1_;
}

Assistant:

char ContentReader::matchAny(const char* chars) {
  if (!buffer(1)) {
    return false;
  }
  int c = buf.front();
  if (auto p = strchr(chars, c)) {
    buf.pop_front();
    return *p;
  }
  return 0;
}